

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

ServiceOptions * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateMessage<google::protobuf::ServiceOptions>
          (Tables *this,ServiceOptions *param_2)

{
  ServiceOptions *pSVar1;
  ServiceOptions *in_RSI;
  ServiceOptions *result;
  ServiceOptions **in_stack_ffffffffffffffd8;
  vector<std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>,_std::allocator<std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  pSVar1 = (ServiceOptions *)operator_new(0x50);
  ServiceOptions::ServiceOptions(in_RSI);
  std::
  vector<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>,std::allocator<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>>>
  ::emplace_back<google::protobuf::ServiceOptions*&>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return pSVar1;
}

Assistant:

Type* DescriptorPool::Tables::AllocateMessage(Type* /* dummy */) {
  Type* result = new Type;
  messages_.emplace_back(result);
  return result;
}